

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateInfo.cpp
# Opt level: O0

void __thiscall helics::FederateInfo::config_additional(FederateInfo *this,App *app)

{
  string_view tomlString;
  string_view jsonString;
  bool bVar1;
  Option *this_00;
  size_t sVar2;
  long in_RDI;
  Option *opt;
  undefined1 in_stack_000005e7;
  string *in_stack_000005e8;
  FederateInfo *in_stack_000005f0;
  undefined1 in_stack_00000797;
  string *in_stack_00000798;
  FederateInfo *in_stack_000007a0;
  Option *local_b0;
  undefined1 in_stack_ffffffffffffff60 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  string *in_stack_ffffffffffffff98;
  App *in_stack_ffffffffffffffa0;
  string *in_stack_ffffffffffffffb0;
  Validator *in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff60._8_8_,
             in_stack_ffffffffffffff60._0_8_);
  this_00 = CLI::App::get_option(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffc7);
  sVar2 = CLI::Option::count((Option *)0x34663b);
  if (sVar2 != 0) {
    CLI::Option::as<std::__cxx11::string>(local_b0);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
    CLI::Validator::operator()(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x34669e);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
    if (bVar1) {
      std::__cxx11::string::operator_cast_to_basic_string_view
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
      tomlString._M_str = in_stack_ffffffffffffffc0;
      tomlString._M_len = (size_t)in_stack_ffffffffffffffb8;
      bVar1 = fileops::hasTomlExtension(tomlString);
      if (bVar1) {
        loadInfoFromToml(in_stack_000005f0,in_stack_000005e8,(bool)in_stack_000005e7);
        *(undefined1 *)(in_RDI + 0x1a0) = 1;
      }
      else {
        std::__cxx11::string::operator_cast_to_basic_string_view
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
        jsonString._M_str = in_stack_ffffffffffffffc0;
        jsonString._M_len = (size_t)in_stack_ffffffffffffffb8;
        bVar1 = fileops::hasJsonExtension(jsonString);
        if (bVar1) {
          loadInfoFromJson(in_stack_000007a0,in_stack_00000798,(bool)in_stack_00000797);
          *(undefined1 *)(in_RDI + 0x1a0) = 1;
        }
      }
    }
  }
  return;
}

Assistant:

void FederateInfo::config_additional(CLI::App* app)
{
    auto* opt = app->get_option("--config");
    if (opt->count() > 0) {
        configString = opt->as<std::string>();
        if (CLI::ExistingFile(configString).empty()) {
            if (fileops::hasTomlExtension(configString)) {
                loadInfoFromToml(configString, false);
                fileInUse = true;

            } else if (fileops::hasJsonExtension(configString)) {
                loadInfoFromJson(configString, false);
                fileInUse = true;
            }
        }
    }
}